

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# datastructure.h
# Opt level: O0

bool operator<(CardStyle *a,CardStyle *b)

{
  CardStyle *b_local;
  CardStyle *a_local;
  bool local_1;
  
  if ((a->type == PASS) && (b->type != PASS)) {
    local_1 = true;
  }
  else if ((a->type == b->type) && ((a->len == b->len && (a->carry == b->carry)))) {
    local_1 = a->id < b->id;
  }
  else if (b->type == JOKER_BOMB) {
    local_1 = true;
  }
  else if ((a->type == JOKER_BOMB) || (b->type != QUARD_BOMB)) {
    local_1 = false;
  }
  else {
    local_1 = true;
  }
  return local_1;
}

Assistant:

inline bool operator<(const CardStyle &a, const CardStyle &b) {
    if (a.type == CardStyle::PASS && b.type != CardStyle::PASS)  return true;
    if (a.type == b.type && a.len == b.len && a.carry == b.carry) {
        return a.id < b.id;
    }
    if (b.type == CardStyle::JOKER_BOMB) {
        return true;
    }
    if (a.type != CardStyle::JOKER_BOMB &&
            b.type == CardStyle::QUARD_BOMB) {
        return true;
    }
    return false;
}